

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

uint32 Socket::inetAddr(String *addr,uint16 *port)

{
  usize *puVar1;
  usize uVar2;
  uint uVar3;
  in_addr_t iVar4;
  char *pcVar5;
  uint uVar6;
  char *pcVar7;
  String local_40;
  
  uVar2 = addr->data->len;
  if (0 < (long)uVar2) {
    pcVar7 = addr->data->str;
    pcVar5 = pcVar7 + uVar2;
    do {
      if (*pcVar7 == ':') goto LAB_00118752;
      pcVar7 = pcVar7 + 1;
    } while (pcVar7 < pcVar5);
  }
  pcVar7 = (char *)0x0;
LAB_00118752:
  if (pcVar7 == (char *)0x0) {
    pcVar7 = String::operator_cast_to_char_(addr);
    iVar4 = inet_addr(pcVar7);
    uVar6 = iVar4 >> 0x18 | (iVar4 & 0xff0000) >> 8 | (iVar4 & 0xff00) << 8 | iVar4 << 0x18;
  }
  else {
    if (port != (uint16 *)0x0) {
      uVar3 = String::toUInt(pcVar7 + 1);
      *port = (uint16)uVar3;
    }
    pcVar5 = String::operator_cast_to_char_(addr);
    String::substr(&local_40,addr,0,(long)pcVar7 - (long)pcVar5);
    pcVar7 = String::operator_cast_to_char_(&local_40);
    iVar4 = inet_addr(pcVar7);
    uVar6 = iVar4 >> 0x18 | (iVar4 & 0xff0000) >> 8 | (iVar4 & 0xff00) << 8 | iVar4 << 0x18;
    if ((local_40.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_40.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_40.data != (Data *)0x0)) {
        operator_delete__(local_40.data);
      }
    }
  }
  return uVar6;
}

Assistant:

uint32 Socket::inetAddr(const String& addr, uint16* port)
{
  const char* portStr = addr.find(':');
  if(portStr)
  {
    if(port)
      *port = (uint16)String::toUInt(portStr + 1);
    return ntohl(inet_addr((const char*)addr.substr(0, (portStr - (const char*)addr))));
  }
  return ntohl(inet_addr((const char*)addr));
}